

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::CacheEquals
               (SSL_CTX *ctx,vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *expected)

{
  pointer *pppsVar1;
  bool bVar2;
  reference ppsVar3;
  iterator iVar4;
  iterator iVar5;
  undefined1 local_78 [8];
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> expected_copy;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> actual;
  SSL_SESSION *session;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *__range2;
  SSL_SESSION *ptr;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *expected_local;
  SSL_CTX *ctx_local;
  
  __range2 = (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)ctx->session_cache_head;
  __end2 = std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::begin(expected);
  session = (SSL_SESSION *)
            std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::end(expected);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<ssl_session_st_*const_*,_std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>_>
                                *)&session);
    if (!bVar2) {
      if (__range2 == (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)0x0) {
        pppsVar1 = &expected_copy.
                    super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                  ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)pppsVar1);
        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                  ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_78);
        lh_SSL_SESSION_doall_arg(ctx->sessions,AppendSession,pppsVar1);
        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::operator=
                  ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_78,expected)
        ;
        pppsVar1 = &expected_copy.
                    super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        iVar4 = std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::begin
                          ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)pppsVar1);
        iVar5 = std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::end
                          ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)pppsVar1);
        std::
        sort<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>>
                  ((__normal_iterator<ssl_session_st_**,_std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>_>
                    )iVar4._M_current,
                   (__normal_iterator<ssl_session_st_**,_std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>_>
                    )iVar5._M_current);
        iVar4 = std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::begin
                          ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_78);
        iVar5 = std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::end
                          ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_78);
        std::
        sort<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>>
                  ((__normal_iterator<ssl_session_st_**,_std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>_>
                    )iVar4._M_current,
                   (__normal_iterator<ssl_session_st_**,_std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>_>
                    )iVar5._M_current);
        ctx_local._7_1_ =
             std::operator==((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)
                             &expected_copy.
                              super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_78
                            );
        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~vector
                  ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_78);
        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~vector
                  ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)
                   &expected_copy.
                    super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ctx_local._7_1_ = false;
      }
      return ctx_local._7_1_;
    }
    ppsVar3 = __gnu_cxx::
              __normal_iterator<ssl_session_st_*const_*,_std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>_>
              ::operator*(&__end2);
    if ((ssl_session_st *)__range2 != *ppsVar3) break;
    if (__range2[10].super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl
        .super__Vector_impl_data._M_start == &ctx->session_cache_tail) {
      __range2 = (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)0x0;
    }
    else {
      __range2 = (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)
                 __range2[10].
                 super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
    __gnu_cxx::
    __normal_iterator<ssl_session_st_*const_*,_std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>_>
    ::operator++(&__end2);
  }
  return false;
}

Assistant:

static bool CacheEquals(SSL_CTX *ctx,
                        const std::vector<SSL_SESSION *> &expected) {
  // Check the linked list.
  SSL_SESSION *ptr = ctx->session_cache_head;
  for (SSL_SESSION *session : expected) {
    if (ptr != session) {
      return false;
    }
    // TODO(davidben): This is an absurd way to denote the end of the list.
    if (ptr->next ==
        reinterpret_cast<SSL_SESSION *>(&ctx->session_cache_tail)) {
      ptr = nullptr;
    } else {
      ptr = ptr->next;
    }
  }
  if (ptr != nullptr) {
    return false;
  }

  // Check the hash table.
  std::vector<SSL_SESSION *> actual, expected_copy;
  lh_SSL_SESSION_doall_arg(ctx->sessions, AppendSession, &actual);
  expected_copy = expected;

  std::sort(actual.begin(), actual.end());
  std::sort(expected_copy.begin(), expected_copy.end());

  return actual == expected_copy;
}